

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# touzet_depth_pruning_tree_index_impl.h
# Opt level: O0

double __thiscall
ted::
TouzetDepthPruningTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>::
tree_dist(TouzetDepthPruningTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
          *this,TreeIndexAll *t1,TreeIndexAll *t2,int x,int y,int k,int e)

{
  UnitCostModelLD<label::StringLabel> *pUVar1;
  initializer_list<double> __l;
  int iVar2;
  int iVar3;
  int iVar4;
  const_reference pvVar5;
  double *pdVar6;
  int *piVar7;
  const_reference pvVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  double local_e0;
  double local_d8;
  double local_d0;
  iterator local_c8;
  undefined8 local_c0;
  double local_b8;
  double local_b0;
  int local_a4;
  int local_a0 [2];
  double local_98;
  double fd_read;
  double td_read;
  int local_7c;
  int local_78;
  int local_74 [3];
  int local_68;
  int j_1;
  int max_depth_it;
  int i;
  TouzetDepthPruningTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
  *pTStack_58;
  int max_depth;
  double candidate_result;
  int local_48;
  int i_1;
  int j;
  int y_off;
  int x_off;
  int y_size;
  int x_size;
  int k_local;
  int y_local;
  int x_local;
  TreeIndexAll *t2_local;
  TreeIndexAll *t1_local;
  TouzetDepthPruningTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
  *this_local;
  
  y_size = k;
  x_size = y;
  k_local = x;
  _y_local = t2;
  t2_local = t1;
  t1_local = (TreeIndexAll *)this;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t1->super_PostLToSize).postl_to_size_,(long)x);
  x_off = *pvVar5;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(_y_local->super_PostLToSize).postl_to_size_,(long)x_size);
  y_off = *pvVar5;
  j = k_local - x_off;
  i_1 = x_size - y_off;
  pdVar6 = data_structures::BandMatrix<double>::at
                     (&(this->
                       super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                       ).
                       super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                       .fd_,0,0);
  *pdVar6 = 0.0;
  for (local_48 = 1; iVar4 = local_48, piVar7 = std::min<int>(&y_off,&e), iVar4 <= *piVar7;
      local_48 = local_48 + 1) {
    pdVar6 = data_structures::BandMatrix<double>::read_at
                       (&(this->
                         super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         .fd_,0,(long)(local_48 + -1));
    dVar11 = *pdVar6;
    pUVar1 = (this->
             super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             ).
             super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             .
             super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             .c_;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(_y_local->super_PostLToLabelId).postl_to_label_id_,(long)(local_48 + i_1))
    ;
    dVar10 = cost_model::UnitCostModelLD<label::StringLabel>::ins(pUVar1,*pvVar5);
    pdVar6 = data_structures::BandMatrix<double>::at
                       (&(this->
                         super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         .fd_,0,(long)local_48);
    *pdVar6 = dVar11 + dVar10;
  }
  if (e + 1 <= y_off) {
    dVar11 = std::numeric_limits<double>::infinity();
    pdVar6 = data_structures::BandMatrix<double>::at
                       (&(this->
                         super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         .fd_,0,(long)(e + 1));
    *pdVar6 = dVar11;
  }
  for (candidate_result._4_4_ = 1; iVar4 = candidate_result._4_4_, piVar7 = std::min<int>(&x_off,&e)
      , iVar4 <= *piVar7; candidate_result._4_4_ = candidate_result._4_4_ + 1) {
    pdVar6 = data_structures::BandMatrix<double>::read_at
                       (&(this->
                         super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         .fd_,(long)(candidate_result._4_4_ + -1),0);
    dVar11 = *pdVar6;
    pUVar1 = (this->
             super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             ).
             super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             .
             super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             .c_;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(t2_local->super_PostLToLabelId).postl_to_label_id_,
                        (long)(candidate_result._4_4_ + j));
    dVar10 = cost_model::UnitCostModelLD<label::StringLabel>::del(pUVar1,*pvVar5);
    pdVar6 = data_structures::BandMatrix<double>::at
                       (&(this->
                         super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         .fd_,(long)candidate_result._4_4_,0);
    *pdVar6 = dVar11 + dVar10;
  }
  if (e + 1 <= x_off) {
    dVar11 = std::numeric_limits<double>::infinity();
    pdVar6 = data_structures::BandMatrix<double>::at
                       (&(this->
                         super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         .fd_,(long)(e + 1),0);
    *pdVar6 = dVar11;
  }
  pTStack_58 = (TouzetDepthPruningTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                *)std::numeric_limits<double>::infinity();
  pvVar5 = std::vector<int,_std::allocator<int>_>::at
                     (&(t2_local->super_PostLToDepth).postl_to_depth_,(long)k_local);
  max_depth_it = *pvVar5 + e + 1;
  pvVar5 = std::vector<int,_std::allocator<int>_>::at
                     (&(t2_local->super_PostLToSubtreeMaxDepth).postl_to_subtree_max_depth_,
                      (long)k_local);
  piVar7 = std::min<int>(&max_depth_it,pvVar5);
  i = *piVar7;
  j_1 = 1;
  local_68 = 0;
  while( true ) {
    pvVar8 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::at(&(t2_local->super_InvertedListDepthToPostL).inverted_list_depth_to_postl_,(long)i)
    ;
    pvVar5 = std::vector<int,_std::allocator<int>_>::at(pvVar8,(long)local_68);
    if (j_1 + j <= *pvVar5) break;
    local_68 = local_68 + 1;
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::at
                     (&(t2_local->super_PostLToDepth).postl_to_depth_,(long)(j_1 + j));
  if (i < *pvVar5) {
    pvVar8 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::at(&(t2_local->super_InvertedListDepthToPostL).inverted_list_depth_to_postl_,(long)i)
    ;
    pvVar5 = std::vector<int,_std::allocator<int>_>::at(pvVar8,(long)local_68);
    j_1 = *pvVar5 - j;
    local_68 = local_68 + 1;
  }
  else {
    pvVar5 = std::vector<int,_std::allocator<int>_>::at
                       (&(t2_local->super_PostLToDepth).postl_to_depth_,(long)(j_1 + j));
    if (*pvVar5 == i) {
      local_68 = local_68 + 1;
    }
  }
  do {
    if (x_off < j_1) {
      (this->
      super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
      ).
      super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
      super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
      subproblem_counter_ =
           (this->
           super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
           ).
           super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
           .super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
           subproblem_counter_ + 1;
      pdVar6 = data_structures::BandMatrix<double>::read_at
                         (&(this->
                           super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           ).
                           super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           .fd_,(long)(x_off + -1),(long)y_off);
      dVar11 = *pdVar6;
      pUVar1 = (this->
               super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
               ).
               super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
               .
               super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
               .c_;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(t2_local->super_PostLToLabelId).postl_to_label_id_,(long)k_local);
      local_e0 = cost_model::UnitCostModelLD<label::StringLabel>::del(pUVar1,*pvVar5);
      local_e0 = dVar11 + local_e0;
      pdVar6 = data_structures::BandMatrix<double>::read_at
                         (&(this->
                           super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           ).
                           super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           .fd_,(long)x_off,(long)(y_off + -1));
      dVar11 = *pdVar6;
      pUVar1 = (this->
               super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
               ).
               super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
               .
               super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
               .c_;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(_y_local->super_PostLToLabelId).postl_to_label_id_,(long)x_size);
      local_d8 = cost_model::UnitCostModelLD<label::StringLabel>::ins(pUVar1,*pvVar5);
      local_d8 = dVar11 + local_d8;
      pdVar6 = data_structures::BandMatrix<double>::read_at
                         (&(this->
                           super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           ).
                           super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           .fd_,(long)(x_off + -1),(long)(y_off + -1));
      dVar11 = *pdVar6;
      pUVar1 = (this->
               super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
               ).
               super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
               .
               super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
               .c_;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(t2_local->super_PostLToLabelId).postl_to_label_id_,(long)k_local);
      iVar4 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(_y_local->super_PostLToLabelId).postl_to_label_id_,(long)x_size);
      local_d0 = cost_model::UnitCostModelLD<label::StringLabel>::ren(pUVar1,iVar4,*pvVar5);
      local_d0 = dVar11 + local_d0;
      local_c8 = &local_e0;
      local_c0 = 3;
      __l._M_len = 3;
      __l._M_array = local_c8;
      pTStack_58 = (TouzetDepthPruningTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                    *)std::min<double>(__l);
      this_local = pTStack_58;
      if ((double)e < (double)pTStack_58) {
        this_local = (TouzetDepthPruningTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                      *)std::numeric_limits<double>::infinity();
      }
      return (double)this_local;
    }
    if (0 < (j_1 - e) + -1) {
      dVar11 = std::numeric_limits<double>::infinity();
      pdVar6 = data_structures::BandMatrix<double>::at
                         (&(this->
                           super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           ).
                           super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           .fd_,(long)j_1,(long)((j_1 - e) + -1));
      *pdVar6 = dVar11;
    }
    local_74[1] = 1;
    local_74[0] = j_1 - e;
    piVar7 = std::max<int>(local_74 + 1,local_74);
    local_74[2] = *piVar7;
    while( true ) {
      iVar4 = local_74[2];
      local_78 = j_1 + e;
      piVar7 = std::min<int>(&local_78,&y_off);
      iVar2 = local_74[2];
      if (*piVar7 < iVar4) break;
      bVar9 = false;
      if (j_1 == x_off) {
        local_7c = j_1 + e;
        piVar7 = std::min<int>(&local_7c,&y_off);
        bVar9 = iVar2 == *piVar7;
      }
      if (bVar9) break;
      (this->
      super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
      ).
      super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
      super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
      subproblem_counter_ =
           (this->
           super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
           ).
           super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
           .super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
           subproblem_counter_ + 1;
      iVar4 = (j_1 + j) - (local_74[2] + i_1);
      if (iVar4 < 1) {
        iVar4 = -iVar4;
      }
      if (y_size < iVar4) {
        dVar11 = std::numeric_limits<double>::infinity();
        pdVar6 = data_structures::BandMatrix<double>::at
                           (&(this->
                             super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                             ).
                             super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                             .fd_,(long)j_1,(long)local_74[2]);
        *pdVar6 = dVar11;
      }
      else {
        pTStack_58 = (TouzetDepthPruningTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                      *)std::numeric_limits<double>::infinity();
        pdVar6 = data_structures::BandMatrix<double>::read_at
                           (&(this->
                             super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                             ).
                             super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                             .fd_,(long)j_1,(long)(local_74[2] + -1));
        dVar11 = *pdVar6;
        pUVar1 = (this->
                 super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                 ).
                 super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                 .
                 super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                 .c_;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(_y_local->super_PostLToLabelId).postl_to_label_id_,
                            (long)(local_74[2] + i_1));
        dVar10 = cost_model::UnitCostModelLD<label::StringLabel>::ins(pUVar1,*pvVar5);
        td_read = dVar11 + dVar10;
        pdVar6 = std::min<double>((double *)&stack0xffffffffffffffa8,&td_read);
        pTStack_58 = (TouzetDepthPruningTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                      *)*pdVar6;
        pdVar6 = data_structures::BandMatrix<double>::read_at
                           (&(this->
                             super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                             ).
                             super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                             .td_,(long)(j_1 + j),(long)(local_74[2] + i_1));
        iVar2 = j_1;
        fd_read = *pdVar6;
        local_98 = 0.0;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(t2_local->super_PostLToSize).postl_to_size_,(long)(j_1 + j));
        iVar4 = local_74[2];
        if ((iVar2 != *pvVar5) ||
           (pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(_y_local->super_PostLToSize).postl_to_size_,
                                (long)(local_74[2] + i_1)), iVar4 != *pvVar5)) {
          iVar2 = local_74[2];
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(_y_local->super_PostLToSize).postl_to_size_,
                              (long)(local_74[2] + i_1));
          iVar3 = j_1;
          iVar4 = *pvVar5;
          local_a0[1] = 0;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(t2_local->super_PostLToSize).postl_to_size_,(long)(j_1 + j));
          local_a0[0] = ((iVar3 - *pvVar5) - e) + -1;
          piVar7 = std::max<int>(local_a0 + 1,local_a0);
          iVar3 = j_1;
          if (iVar2 - iVar4 < *piVar7) {
            local_98 = std::numeric_limits<double>::infinity();
          }
          else {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(t2_local->super_PostLToSize).postl_to_size_,(long)(j_1 + j));
            local_a4 = (iVar3 - *pvVar5) + e + 1;
            piVar7 = std::min<int>(&local_a4,&y_off);
            iVar2 = local_74[2];
            iVar4 = *piVar7;
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(_y_local->super_PostLToSize).postl_to_size_,
                                (long)(local_74[2] + i_1));
            iVar3 = j_1;
            if (iVar4 < iVar2 - *pvVar5) {
              local_98 = std::numeric_limits<double>::infinity();
            }
            else {
              pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&(t2_local->super_PostLToSize).postl_to_size_,(long)(j_1 + j));
              iVar2 = local_74[2];
              iVar4 = *pvVar5;
              pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&(_y_local->super_PostLToSize).postl_to_size_,
                                  (long)(local_74[2] + i_1));
              pdVar6 = data_structures::BandMatrix<double>::read_at
                                 (&(this->
                                   super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                   ).
                                   super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                   .fd_,(long)(iVar3 - iVar4),(long)(iVar2 - *pvVar5));
              local_98 = *pdVar6;
            }
          }
        }
        local_b0 = local_98 + fd_read;
        pdVar6 = std::min<double>((double *)&stack0xffffffffffffffa8,&local_b0);
        pTStack_58 = (TouzetDepthPruningTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                      *)*pdVar6;
        if (j_1 == 1) {
LAB_00117c4d:
          pdVar6 = data_structures::BandMatrix<double>::read_at
                             (&(this->
                               super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                               ).
                               super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                               .fd_,(long)(j_1 + -1),(long)local_74[2]);
          dVar11 = *pdVar6;
          pUVar1 = (this->
                   super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                   ).
                   super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                   .
                   super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                   .c_;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(t2_local->super_PostLToLabelId).postl_to_label_id_,(long)(j_1 + j));
          local_b8 = cost_model::UnitCostModelLD<label::StringLabel>::del(pUVar1,*pvVar5);
          local_b8 = dVar11 + local_b8;
          pdVar6 = std::min<double>((double *)&stack0xffffffffffffffa8,&local_b8);
          pTStack_58 = (TouzetDepthPruningTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                        *)*pdVar6;
        }
        else if (1 < j_1) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::at
                             (&(t2_local->super_PostLToDepth).postl_to_depth_,(long)(j_1 + -1 + j));
          iVar4 = *pvVar5;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(t2_local->super_PostLToDepth).postl_to_depth_,(long)k_local);
          if (iVar4 - *pvVar5 <= e + 1) goto LAB_00117c4d;
        }
        dVar11 = (double)pTStack_58;
        if ((double)pTStack_58 <= (double)e) {
          pdVar6 = data_structures::BandMatrix<double>::at
                             (&(this->
                               super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                               ).
                               super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                               .fd_,(long)j_1,(long)local_74[2]);
          *pdVar6 = dVar11;
        }
        else {
          dVar11 = std::numeric_limits<double>::infinity();
          pdVar6 = data_structures::BandMatrix<double>::at
                             (&(this->
                               super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                               ).
                               super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                               .fd_,(long)j_1,(long)local_74[2]);
          *pdVar6 = dVar11;
        }
      }
      local_74[2] = local_74[2] + 1;
    }
    if (j_1 + e + 1 <= y_off) {
      dVar11 = std::numeric_limits<double>::infinity();
      pdVar6 = data_structures::BandMatrix<double>::at
                         (&(this->
                           super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           ).
                           super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           .fd_,(long)j_1,(long)(j_1 + e + 1));
      *pdVar6 = dVar11;
    }
    j_1 = j_1 + 1;
    if ((x_off < j_1) ||
       (pvVar5 = std::vector<int,_std::allocator<int>_>::at
                           (&(t2_local->super_PostLToDepth).postl_to_depth_,(long)(j_1 + j)),
       *pvVar5 <= i)) {
      if ((j_1 <= x_off) &&
         (pvVar5 = std::vector<int,_std::allocator<int>_>::at
                             (&(t2_local->super_PostLToDepth).postl_to_depth_,(long)(j_1 + j)),
         *pvVar5 == i)) {
        local_68 = local_68 + 1;
      }
    }
    else {
      pvVar8 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::at(&(t2_local->super_InvertedListDepthToPostL).inverted_list_depth_to_postl_,
                    (long)i);
      pvVar5 = std::vector<int,_std::allocator<int>_>::at(pvVar8,(long)local_68);
      j_1 = *pvVar5 - j;
      local_68 = local_68 + 1;
    }
  } while( true );
}

Assistant:

double TouzetDepthPruningTreeIndex<CostModel, TreeIndex>::tree_dist(
    const TreeIndex& t1, const TreeIndex& t2, const int x,
    const int y, const int k, const int e) {
  int x_size = t1.postl_to_size_[x];
  int y_size = t2.postl_to_size_[y];
  
  // std::cout << "TouzetDepthPruningTreeIndex::tree_dist" << std::endl;
  
  // Calculates offsets that let us translate i and j to correct postorder ids.
  int x_off = x - x_size;
  int y_off = y - y_size;

  // Initial cases.
  fd_.at(0, 0) = 0.0; // (0,0) is always within e-strip.
  for (int j = 1; j <= std::min(y_size, e); ++j) { // i = 0; only j that are within e-strip.
    fd_.at(0, j) = fd_.read_at(0, j - 1) + c_.ins(t2.postl_to_label_id_[j + y_off]);
  }
  if (e + 1 <= y_size) { // the first j that is outside e-strip
    fd_.at(0, e + 1) = std::numeric_limits<double>::infinity();
  }
  // QUESTION: Is it necessary to verify depths here?
  //           It is not, because these values will never be used. We write
  //           them not to verify the condition.
  for (int i = 1; i <= std::min(x_size, e); ++i) { // j = 0; only i that are within e-strip.
    fd_.at(i, 0) = fd_.read_at(i - 1, 0) + c_.del(t1.postl_to_label_id_[i + x_off]);
  }
  if (e + 1 <= x_size) { // the first i that is outside e-strip
    fd_.at(e + 1, 0) = std::numeric_limits<double>::infinity();
  }

  double candidate_result = std::numeric_limits<double>::infinity();

  // General cases.

  // NOTE: max_depth has to be set to min(depth(x)+e+1, max depth of T1_x)
  //       because e+1 may exceed the maximum depth of T1_x.
  // TODO: Figure out why e+1.
  int max_depth = std::min(t1.postl_to_depth_.at(x) + e + 1, t1.postl_to_subtree_max_depth_.at(x));

  int i = 1;
  int max_depth_it = 0;
  // Move max_depth_it to point to the first node within this subtree (T1_x).
  // TODO: This requires a scan of one depth inversted list. Can we do better?
  while (t1.inverted_list_depth_to_postl_.at(max_depth).at(max_depth_it) < i + x_off) {
    ++max_depth_it;
  }
  // Set the first i-value for the loop
  // TODO: Make this if more elegant.
  if (t1.postl_to_depth_.at(i + x_off) > max_depth) {
    // x_off has to be substructed to get correct i.
    i = t1.inverted_list_depth_to_postl_.at(max_depth).at(max_depth_it) - x_off;
    ++max_depth_it;
  } else if (t1.postl_to_depth_.at(i + x_off) == max_depth) {
    ++max_depth_it;
  }
  // Traversing truncated tree to filter out i-values based on depth.
  while (i <= x_size) {
    // Old if statement for filtering i-values based on depth.
    // if (t1_depth_[i + x_off] - t1_depth_[x] > e + 1) { continue; }
    if (i - e - 1 >= 1) { // First j that is outside e-strip.
      fd_.at(i, i - e - 1) = std::numeric_limits<double>::infinity();
    }
    for (int j = std::max(1, i - e); j <= std::min(i + e, y_size); ++j) { // only (i,j) that are in e-strip
      // The td(x_size-1, y_size-1) is computed differently.
      // TODO: This condition is evaluated too often but passes only on the
      //       last i and j.
      if (i == x_size && j == std::min(i + e, y_size)) {
        break;
      }
      ++subproblem_counter_;
      if (std::abs((i + x_off) - (j + y_off)) > k) {
        fd_.at(i, j) = std::numeric_limits<double>::infinity();
      } else {
        candidate_result = std::numeric_limits<double>::infinity();
        candidate_result = std::min(candidate_result, fd_.read_at(i, j - 1) +
            c_.ins(t2.postl_to_label_id_[j + y_off]));
        double td_read = td_.read_at(i + x_off, j + y_off);
        double fd_read = 0.0;
        // If one of the forests is a tree, look up the vlaues in fd_.
        // Otherwise, both forests are trees and the fd-part is empty.
        if (i - t1.postl_to_size_[i + x_off] != 0 || j - t2.postl_to_size_[j + y_off] != 0) {
          // If the values to read are outside of the band, they exceed
          // the threshold or are not present in the band-matrix.
          if (j - t2.postl_to_size_[j + y_off] < std::max(0, i - t1.postl_to_size_[i + x_off] - e - 1)) {
            fd_read = std::numeric_limits<double>::infinity();
          } else if (std::min(i - t1.postl_to_size_[i + x_off] + e + 1, y_size) < j - t2.postl_to_size_[j + y_off]) {
            fd_read = std::numeric_limits<double>::infinity();
          } else {
            fd_read = fd_.read_at(i - t1.postl_to_size_[i + x_off], j - t2.postl_to_size_[j + y_off]);
          }
        }
        candidate_result = std::min(candidate_result, fd_read + td_read);

        // Value at (i-1,j) may not be calculated due to truncated tree,
        // thus it has to be verified separately.
        // NOTE: For i=1 there may be an out of bound exception for depth
        //       lookup.
        if (i == 1 || (i > 1 && t1.postl_to_depth_.at(i - 1 + x_off) - t1.postl_to_depth_[x] <= e + 1)) {
          candidate_result = std::min(
            candidate_result,
            fd_.read_at(i - 1, j) + c_.del(t1.postl_to_label_id_[i + x_off])
          );
        }

        // None of the values in fd_ can be greater than e-value for this
        // subtree pair.
        if (candidate_result > e) {
          fd_.at(i, j) = std::numeric_limits<double>::infinity();
        } else {
          fd_.at(i, j) = candidate_result;
        }
      }
    }
    if (i + e + 1 <= y_size) { // Last j that is outside e-strip.
      fd_.at(i, i + e + 1) = std::numeric_limits<double>::infinity();
    }
    // Set next i to iterate.
    ++i;
    // NOTE: i <= x_size verifies depth and dil[max_depth] bounds.
    // NOTE: For i=x_size (subtree root) the depth is always smaller than
    //       max_depth.
    // TODO: Make this if more elegant.
    if (i <= x_size && t1.postl_to_depth_.at(i + x_off) > max_depth) {
      // If depth of i is greater than max_depth, there must be an ancestor
      // of i with depth equals max_depth, and max_depth_it points to it.
      // x_off has to be substructed to get correct i.
      i = t1.inverted_list_depth_to_postl_.at(max_depth).at(max_depth_it) - x_off;
      ++max_depth_it;
    } else if (i <= x_size && t1.postl_to_depth_.at(i + x_off) == max_depth) {
      ++max_depth_it;
    }
  }
  
  ++subproblem_counter_;
  // QUESTION: Is it possible that for some e-value an infinity should be
  //           returned, because the last subproblem is too far away?
  candidate_result = std::min({
    fd_.read_at(x_size - 1, y_size) + c_.del(t1.postl_to_label_id_[x]),                 // Delete root in source subtree.
    fd_.read_at(x_size, y_size - 1) + c_.ins(t2.postl_to_label_id_[y]),                 // Insert root in destination subtree.
    fd_.read_at(x_size - 1, y_size - 1) + c_.ren(t1.postl_to_label_id_[x], t2.postl_to_label_id_[y]) // Rename root nodes of the subtrees.
  });
  // The distance between two subtrees cannot be greater than e-value for these
  // subtrees.
  if (candidate_result > e) {
    return std::numeric_limits<double>::infinity();
  } else {
    return candidate_result;
  }
}